

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncloseWorld.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_160::EncloseWorld::run(EncloseWorld *this,Module *module)

{
  HeapType *this_00;
  undefined8 *puVar1;
  pointer pTVar2;
  Export *pEVar3;
  char *pcVar4;
  uintptr_t uVar5;
  pointer puVar6;
  Type TVar7;
  bool bVar8;
  pointer puVar9;
  Function *pFVar10;
  pointer ppEVar11;
  Type *pTVar12;
  undefined8 *puVar13;
  Type *__args;
  Expression *pEVar14;
  RefAs *pRVar15;
  Function *this_01;
  Call *pCVar16;
  Type this_02;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  pointer *pppEVar17;
  undefined1 curr [8];
  Type TVar18;
  pointer pTVar19;
  pointer *ppTVar20;
  Type TVar21;
  Signature SVar22;
  string_view sVar23;
  Name NVar24;
  HeapType local_120;
  Type *local_118;
  pointer local_110;
  pointer local_108;
  variant<wasm::Name,_wasm::HeapType> *local_100;
  undefined1 auStack_f8 [8];
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  char *local_d8;
  HeapType local_d0;
  Type local_c0;
  Type externref;
  Builder local_a8;
  Builder builder;
  undefined1 auStack_98 [8];
  Iterator __begin2;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> params;
  Tuple local_58;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  auStack_f8 = (undefined1  [8])0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar9 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  builder.wasm = module;
  if (puVar9 != local_108) {
    do {
      pppEVar17 = &params.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      ppTVar20 = &local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      pEVar3 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      local_110 = puVar9;
      if (pEVar3->kind == Function) {
        local_100 = &pEVar3->value;
        if (*(__index_type *)
             ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) != '\0'
           ) {
          local_100 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        TVar18.id = *(uintptr_t *)
                     &(local_100->super__Variant_base<wasm::Name,_wasm::HeapType>).
                      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>;
        pFVar10 = Module::getFunction(builder.wasm,
                                      (IString)*(IString *)
                                                &(local_100->
                                                 super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                 .
                                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                     );
        this_00 = &pFVar10->type;
        SVar22 = HeapType::getSignature(this_00);
        local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)SVar22.params.id;
        auStack_78 = (undefined1  [8])&local_58;
        params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ppEVar11 = (pointer)wasm::Type::size((Type *)auStack_78);
        if (ppEVar11 != (pointer)0x0) {
          do {
            pTVar12 = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
            bVar8 = isOpenRef((EncloseWorld *)pTVar12->id,TVar18);
            if (bVar8) goto LAB_0085bcde;
            params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)params.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
          } while ((params.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != ppEVar11) ||
                  (auStack_78 != (undefined1  [8])&local_58));
        }
        SVar22 = HeapType::getSignature(this_00);
        bVar8 = isOpenRef((EncloseWorld *)SVar22.results.id.id,TVar18);
        if (bVar8) {
LAB_0085bcde:
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x5;
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT26(local_58.
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage._6_2_,0x2462757473);
          pcVar4 = (pFVar10->super_Importable).super_Named.name.super_IString.str._M_str;
          auStack_98 = (undefined1  [8])
                       &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index;
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppTVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_98,pcVar4,
                     pcVar4 + (pFVar10->super_Importable).super_Named.name.super_IString.str._M_len)
          ;
          pTVar19 = (pointer)0xf;
          if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)ppTVar20) {
            pTVar19 = local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          pTVar2 = (pointer)((long)&(local_58.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_finish)->id +
                            (long)&(__begin2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id);
          if (pTVar19 < pTVar2) {
            pTVar19 = (pointer)0xf;
            if (auStack_98 !=
                (undefined1  [8])
                &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)
            {
              pTVar19 = (pointer)__begin2.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index;
            }
            if (pTVar19 < pTVar2) goto LAB_0085bd67;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)auStack_98,0,(char *)0x0,
                                 (ulong)local_58.
                                        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          }
          else {
LAB_0085bd67:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_58,(ulong)auStack_98);
          }
          puVar1 = puVar13 + 2;
          if ((pointer *)*puVar13 == (pointer *)puVar1) {
            params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar1;
            params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar13[3];
            auStack_78 = (undefined1  [8])pppEVar17;
          }
          else {
            params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar1;
            auStack_78 = (undefined1  [8])*puVar13;
          }
          params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)puVar13[1];
          *puVar13 = puVar1;
          puVar13[1] = 0;
          *(undefined1 *)puVar1 = 0;
          sVar23._M_str = (char *)0x0;
          sVar23._M_len = (size_t)auStack_78;
          sVar23 = IString::interned((IString *)
                                     params.
                                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,sVar23,
                                     SUB81(puVar1,0));
          TVar18.id = sVar23._M_len;
          NVar24 = Names::getValidFunctionName(builder.wasm,(Name)sVar23);
          if (auStack_78 != (undefined1  [8])pppEVar17) {
            TVar18.id = (long)params.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1;
            operator_delete((void *)auStack_78,TVar18.id);
          }
          if (auStack_98 !=
              (undefined1  [8])
              &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
            TVar18.id = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index + 1;
            operator_delete((void *)auStack_98,TVar18.id);
          }
          if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)ppTVar20) {
            TVar18.id = (long)&(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->id + 1;
            operator_delete(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start,TVar18.id);
          }
          local_a8.wasm = builder.wasm;
          params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_78 = (undefined1  [8])0x0;
          params.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_c0.id = 10;
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (Type *)0x0;
          SVar22 = HeapType::getSignature(this_00);
          externref = SVar22.params.id;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          auStack_98 = (undefined1  [8])&externref;
          pTVar12 = (Type *)wasm::Type::size(&externref);
          bVar8 = auStack_98 != (undefined1  [8])&externref;
          local_118 = pTVar12;
          if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
              pTVar12) goto LAB_0085c057;
          do {
            do {
              __args = wasm::Type::Iterator::operator*((Iterator *)auStack_98);
              bVar8 = isOpenRef((EncloseWorld *)__args->id,TVar18);
              pTVar2 = local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pTVar19 = local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_start;
              TVar18.id = local_c0.id;
              if (bVar8) {
                pEVar14 = (Expression *)MixedArena::allocSpace(&(local_a8.wasm)->allocator,0x18,8);
                pEVar14->_id = LocalGetId;
                *(int *)(pEVar14 + 1) = (int)((ulong)((long)pTVar2 - (long)pTVar19) >> 3);
                (pEVar14->type).id = TVar18.id;
                pRVar15 = (RefAs *)MixedArena::allocSpace(&(local_a8.wasm)->allocator,0x20,8);
                (pRVar15->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id =
                     RefAsId;
                (pRVar15->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.
                id = 0;
                pRVar15->op = AnyConvertExtern;
                pRVar15->value = pEVar14;
                RefAs::finalize(pRVar15);
                uVar5 = __args->id;
                this_01 = (Function *)MixedArena::allocSpace(&(local_a8.wasm)->allocator,0x18,8);
                pTVar12 = local_118;
                *(Id *)&(this_01->super_Importable).super_Named.name.super_IString.str._M_len =
                     RefCastId;
                *(RefAs **)&(this_01->super_Importable).super_Named.hasExplicitName = pRVar15;
                ((Type *)&(this_01->super_Importable).super_Named.name.super_IString.str._M_str)->id
                     = uVar5;
                RefCast::finalize((RefCast *)this_01);
                local_38._M_head_impl = this_01;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78
                           ,(Expression **)&local_38);
                TVar18.id = local_c0.id;
                if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  TVar18.id = (uintptr_t)
                              local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  std::vector<wasm::Type,std::allocator<wasm::Type>>::
                  _M_realloc_insert<wasm::Type_const&>
                            ((vector<wasm::Type,std::allocator<wasm::Type>> *)&local_58,
                             (iterator)
                             local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_c0);
                }
                else {
LAB_0085bffa:
                  (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish)->id = TVar18.id;
                  TVar18.id = (uintptr_t)
                              (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1);
                  local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)TVar18.id;
                }
              }
              else {
                uVar5 = __args->id;
                local_38._M_head_impl =
                     (Function *)MixedArena::allocSpace(&(local_a8.wasm)->allocator,0x18,8);
                *(Id *)&((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.
                        str._M_len = LocalGetId;
                *(int *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName =
                     (int)((ulong)((long)pTVar2 - (long)pTVar19) >> 3);
                ((Type *)&((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString
                          .str._M_str)->id = uVar5;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78
                           ,(Expression **)&local_38);
                if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  TVar18.id = (uintptr_t)__args->id;
                  goto LAB_0085bffa;
                }
                TVar18.id = (uintptr_t)
                            local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                std::vector<wasm::Type,std::allocator<wasm::Type>>::
                _M_realloc_insert<wasm::Type_const&>
                          ((vector<wasm::Type,std::allocator<wasm::Type>> *)&local_58,
                           (iterator)
                           local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_finish,__args);
              }
              __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
              bVar8 = auStack_98 != (undefined1  [8])&externref;
            } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar12);
LAB_0085c057:
          } while (bVar8);
          TVar18.id = (pFVar10->super_Importable).super_Named.name.super_IString.str._M_len;
          sVar23 = (pFVar10->super_Importable).super_Named.name.super_IString.str;
          SVar22 = HeapType::getSignature(this_00);
          pCVar16 = Builder::makeCall(&local_a8,(Name)sVar23,
                                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)auStack_78,SVar22.results.id,false);
          SVar22 = HeapType::getSignature(this_00);
          this_02 = SVar22.results.id;
          bVar8 = isOpenRef((EncloseWorld *)this_02.id,TVar18);
          TVar21.id = local_c0.id;
          TVar18.id = (uintptr_t)&local_58;
          wasm::Type::Type(&externref,(Tuple *)TVar18.id);
          TVar7 = externref;
          if (!bVar8) {
            TVar21.id = this_02.id;
          }
          bVar8 = isOpenRef((EncloseWorld *)this_02.id,TVar18);
          if (bVar8) {
            pRVar15 = (RefAs *)MixedArena::allocSpace(&(local_a8.wasm)->allocator,0x20,8);
            (pRVar15->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id =
                 RefAsId;
            (pRVar15->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id =
                 0;
            pRVar15->op = ExternConvertAny;
            pRVar15->value = (Expression *)pCVar16;
            RefAs::finalize(pRVar15);
          }
          SVar22.results.id = TVar21.id;
          SVar22.params.id = TVar7.id;
          HeapType::HeapType(&local_120,SVar22);
          auStack_98 = (undefined1  [8])0x0;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
          local_d8 = NVar24.super_IString.str._M_len;
          local_d0.id = NVar24.super_IString.str._M_str;
          NVar24.super_IString.str._M_str = local_d8;
          NVar24.super_IString.str._M_len = (size_t)&local_38;
          Builder::makeFunction
                    (NVar24,local_d0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_120.id
                     ,(Expression *)auStack_98);
          Module::addFunction(builder.wasm,
                              (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                              &local_38);
          if (local_38._M_head_impl != (Function *)0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
          }
          local_38._M_head_impl = (Function *)0x0;
          if (auStack_98 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_98,
                            __begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index - (long)auStack_98);
          }
          if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (auStack_78 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_78,
                            (long)params.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
          }
          *(char **)&(local_100->super__Variant_base<wasm::Name,_wasm::HeapType>).
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                     super__Copy_assign_alias<wasm::Name,_wasm::HeapType> = local_d8;
          *(uintptr_t *)
           ((long)&(local_100->super__Variant_base<wasm::Name,_wasm::HeapType>).
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType> + 8) = local_d0.id;
        }
      }
      puVar6 = newExports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = local_110 + 1;
      curr = auStack_f8;
    } while (puVar9 != local_108);
    for (; curr != (undefined1  [8])puVar6; curr = (undefined1  [8])((long)curr + 8)) {
      Module::addExport(builder.wasm,
                        (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)curr);
    }
  }
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)auStack_f8);
  return;
}

Assistant:

void run(Module* module) override {
    // Handle exports.
    // TODO: Non-function exports.
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        // If this opens up types, replace it with an enclosed stub.
        if (opensTypes(func)) {
          auto stubName = makeStubStubForExport(func, module);
          *name = stubName;
        }
      }
    }
    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }

    // TODO: Handle imports.
  }